

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# semantics.c
# Opt level: O0

attr * SEM_ParamDec(ast *node,field_t **f)

{
  field_t *pfVar1;
  long *in_RSI;
  ast *in_RDI;
  attr *unaff_retaddr;
  field_t *p;
  attr *s;
  ast *in_stack_ffffffffffffffd8;
  field_t *local_20;
  
  child(in_RDI,1);
  SEM_Specifier(in_stack_ffffffffffffffd8);
  local_20 = (field_t *)*in_RSI;
  if (*in_RSI == 0) {
    child(in_RDI,2);
    local_20 = SEM_VarDec((ast *)p,unaff_retaddr,(int)((ulong)in_RDI >> 0x20));
    *in_RSI = (long)local_20;
  }
  else {
    for (; *(long *)((long)local_20 + 0x18) != 0; local_20 = *(field_t **)((long)local_20 + 0x18)) {
    }
    child(in_RDI,2);
    pfVar1 = SEM_VarDec((ast *)p,unaff_retaddr,(int)((ulong)in_RDI >> 0x20));
    *(field_t **)((long)local_20 + 0x18) = pfVar1;
    local_20 = *(field_t **)((long)local_20 + 0x18);
  }
  return local_20->type;
}

Assistant:

static struct attr* SEM_ParamDec(struct ast *node, struct field_t **f) {
    struct attr *s = SEM_Specifier(child(node, 1));
    struct field_t *p = *f;
    if (*f == NULL) {
        p = SEM_VarDec(child(node, 2), s, 0);
        *f = p;
    }
    else {
        while (p->next)
            p = p->next;
        p->next = SEM_VarDec(child(node, 2), s, 0);
        p = p->next;
    }
    return p->type;
}